

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propd.c
# Opt level: O3

int start_property_service(void)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  size_t sVar4;
  DIR *__dirp;
  dirent *pdVar5;
  ssize_t sVar6;
  uint __fd;
  char *pcVar7;
  char value [92];
  stat sb;
  undefined1 local_10a8 [17];
  undefined4 uStack_1097;
  stat local_1038 [28];
  
  iVar1 = stat("/tmp/linux-sysprop",local_1038);
  if (iVar1 < 0) {
    puVar3 = (uint *)__errno_location();
    uVar2 = *puVar3;
    if (uVar2 == 2) {
LAB_00109434:
      __fd = 0;
      uVar2 = socket(1,1,0);
      if ((int)uVar2 < 0) {
        puVar3 = (uint *)__errno_location();
        printf("UNIX domain socket create failed (errno=%d)\n",(ulong)*puVar3);
      }
      else {
        local_10a8[2] = '/';
        local_10a8[3] = 't';
        local_10a8[4] = 'm';
        local_10a8[5] = 'p';
        local_10a8[6] = '/';
        local_10a8[7] = 'l';
        local_10a8[8] = 'i';
        local_10a8[9] = 'n';
        local_10a8._10_7_ = 0x707379732d7875;
        uStack_1097 = 0x706f72;
        local_10a8._0_2_ = 1;
        sVar4 = strlen(local_10a8 + 2);
        iVar1 = bind(uVar2,(sockaddr *)local_10a8,(int)sVar4 + 2);
        if (iVar1 < 0) {
          puVar3 = (uint *)__errno_location();
          printf("AF_UNIX bind failed for \'%s\' (errno=%d)\n","/tmp/linux-sysprop",(ulong)*puVar3);
        }
        else {
          iVar1 = listen(uVar2,5);
          if (-1 < iVar1) {
            __fd = uVar2 & 0xff;
            goto LAB_00109522;
          }
          puVar3 = (uint *)__errno_location();
          printf("AF_UNIX listen failed (errno=%d)\n",(ulong)*puVar3);
        }
        close(uVar2);
        __fd = 0;
      }
      goto LAB_00109522;
    }
    pcVar7 = "Unable to stat \'%s\' (errno=%d)\n";
  }
  else {
    if ((local_1038[0].st_mode & 0xf000) != 0xc000) {
      __fd = 0;
      printf("File \'%s\' exists and is not a socket\n","/tmp/linux-sysprop");
      goto LAB_00109522;
    }
    iVar1 = unlink("/tmp/linux-sysprop");
    if (-1 < iVar1) goto LAB_00109434;
    puVar3 = (uint *)__errno_location();
    uVar2 = *puVar3;
    pcVar7 = "Unable to remove \'%s\' (errno=%d)\n";
  }
  __fd = 0;
  printf(pcVar7,"/tmp/linux-sysprop",(ulong)uVar2);
LAB_00109522:
  __dirp = opendir("/platform//property/");
  if (__dirp == (DIR *)0x0) {
    puVar3 = (uint *)__errno_location();
    log_write(3,"<3>init: Unable to open persistent property directory %s errno: %d\n",
              "/platform//property/",(ulong)*puVar3);
  }
  else {
    pdVar5 = readdir(__dirp);
    if (pdVar5 != (dirent *)0x0) {
      do {
        pcVar7 = pdVar5->d_name;
        iVar1 = strncmp("persist.",pcVar7,8);
        if (iVar1 == 0) {
          snprintf((char *)local_1038,0x1000,"%s/%s","/platform//property/",pcVar7);
          iVar1 = open((char *)local_1038,0);
          if (iVar1 < 0) {
            puVar3 = (uint *)__errno_location();
            log_write(3,"<3>init: Unable to open persistent property file %s errno: %d\n",local_1038
                      ,(ulong)*puVar3);
          }
          else {
            sVar6 = read(iVar1,local_10a8,0x5b);
            if ((int)(uint)sVar6 < 0) {
              puVar3 = (uint *)__errno_location();
              log_write(3,"<3>init: Unable to read persistent property file %s errno: %d\n",
                        local_1038,(ulong)*puVar3);
            }
            else {
              local_10a8[(uint)sVar6 & 0x7fffffff] = 0;
              property_set(pcVar7,local_10a8);
            }
            close(iVar1);
          }
        }
        pdVar5 = readdir(__dirp);
      } while (pdVar5 != (dirent *)0x0);
    }
    closedir(__dirp);
  }
  persistent_properties_loaded = 1;
  fcntl(__fd,2,1);
  fcntl(__fd,4,0x800);
  return __fd;
}

Assistant:

static int create_property_socket(const char* fileName)
{
    struct stat sb;
    unsigned char result = (0);
    int sock = -1;
    int cc;

    cc = stat(fileName, &sb);
    if (cc < 0) {
        if (errno != ENOENT) {
            printf(
                "Unable to stat '%s' (errno=%d)\n", fileName, errno);
            goto bail;
        }
    } else {
        /* don't touch it if it's not a socket */
        if (!(S_ISSOCK(sb.st_mode))) {
            printf(
                "File '%s' exists and is not a socket\n", fileName);
            goto bail;
        }

        /* remove the cruft */
        if (unlink(fileName) < 0) {
            printf(
                "Unable to remove '%s' (errno=%d)\n", fileName, errno);
            goto bail;
        }
    }

    struct sockaddr_un addr;

    sock = socket(AF_UNIX, SOCK_STREAM, 0);
    if (sock < 0) {
        printf(
            "UNIX domain socket create failed (errno=%d)\n", errno);
        goto bail;
    }

    /* bind the socket; this creates the file on disk */
    strcpy(addr.sun_path, fileName);    // max 108 bytes
    addr.sun_family = AF_UNIX;
    cc = bind(sock, (struct sockaddr*) &addr, SUN_LEN(&addr));
    if (cc < 0) {
        printf("AF_UNIX bind failed for '%s' (errno=%d)\n", fileName, errno);
        goto bail;
    }

    cc = listen(sock, 5);
    if (cc < 0) {
        printf("AF_UNIX listen failed (errno=%d)\n", errno);
        goto bail;
    }

    result = sock;
    sock = -1;
    return result;

bail:
    if (sock >= 0)
        close(sock);
    return result;
}